

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::ImplicitConversionsInvalidTest::prepareShaderSource
          (ImplicitConversionsInvalidTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  pointer psVar1;
  ulong uVar2;
  TestError *this_00;
  char *pcVar3;
  char *pcVar4;
  undefined4 in_register_00000034;
  size_t position;
  GLchar *local_68;
  GLchar *local_60;
  size_t local_58;
  string local_50;
  
  uVar2 = (ulong)this->m_current_test_case_index;
  if (uVar2 < 4) {
    local_60 = Utils::getTypeName::int_lut[uVar2];
    local_68 = Utils::getTypeName::uint_lut[uVar2];
  }
  else {
    local_60 = (GLchar *)0x0;
    local_68 = (GLchar *)0x0;
  }
  getValueList_abi_cxx11_
            (&local_50,(ImplicitConversionsInvalidTest *)CONCAT44(in_register_00000034,in_stage),
             this->m_current_test_case_index + 1);
  if (in_stage < SHADER_STAGES_MAX) {
    pcVar3 = (&PTR_anon_var_dwarf_5e338a_020e7ce8)[in_stage];
    psVar1 = (out_source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = (char *)(psVar1->m_code)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)pcVar3);
    local_58 = 0;
    pcVar3 = "#version 420";
    if (in_use_version_400) {
      pcVar3 = 
      "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
      ;
    }
    pcVar4 = "#version 430";
    if (in_stage != COMPUTE_SHADER) {
      pcVar4 = pcVar3;
    }
    Utils::replaceToken("VERSION",&local_58,pcVar4,
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("FUNCTION_DEFINITION",&local_58,
                        "T1 function(in T2 left, in T2 right)\n{\n    return left + right;\n}\n",
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("VERIFICATION",&local_58,
                        "    const T2 const_left  = T2(VALUE_LIST);\n    const T2 const_right = T2(VALUE_LIST);\n\n    T1 const_result = function(const_left, const_right);\n\n    T1 literal_result = function(T2(VALUE_LIST), T2(VALUE_LIST));\n\n    T2 var_left  = uni_left;\n    T2 var_right = uni_right;\n\n    T1 var_result = function(var_left, var_right);\n\n    if ((literal_result != const_result) ||\n        (const_result   != var_result) )\n    {\n        result = vec4(1, 0, 0, 1);\n    }\n"
                        ,&((out_source->m_parts).
                           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceAllTokens
              ("VALUE_LIST",local_50._M_dataplus._M_p,
               &((out_source->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceAllTokens
              ("T1",local_60,
               &((out_source->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceAllTokens
              ("T2",local_68,
               &((out_source->m_parts).
                 super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_code);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x132d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ImplicitConversionsInvalidTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
														 Utils::shaderSource& out_source)
{
	static const GLchar* function_definition = "T1 function(in T2 left, in T2 right)\n"
											   "{\n"
											   "    return left + right;\n"
											   "}\n";

	static const GLchar* verification_snippet = "    const T2 const_left  = T2(VALUE_LIST);\n"
												"    const T2 const_right = T2(VALUE_LIST);\n"
												"\n"
												"    T1 const_result = function(const_left, const_right);\n"
												"\n"
												"    T1 literal_result = function(T2(VALUE_LIST), T2(VALUE_LIST));\n"
												"\n"
												"    T2 var_left  = uni_left;\n"
												"    T2 var_right = uni_right;\n"
												"\n"
												"    T1 var_result = function(var_left, var_right);\n"
												"\n"
												"    if ((literal_result != const_result) ||\n"
												"        (const_result   != var_result) )\n"
												"    {\n"
												"        result = vec4(1, 0, 0, 1);\n"
												"    }\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"          uniform T2 uni_left;\n"
		"          uniform T2 uni_right;\n"
		"\n"
		"FUNCTION_DEFINITION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template = "VERSION\n"
													"\n"
													"in  vec4 gs_fs_result;\n"
													"out vec4 fs_out_result;\n"
													"uniform T2 uni_left;\n"
													"uniform T2 uni_right;\n"
													"\n"
													"FUNCTION_DEFINITION"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != gs_fs_result)\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    fs_out_result = result;\n"
													"}\n"
													"\n";

	static const GLchar* geometry_shader_template = "VERSION\n"
													"\n"
													"layout(points)                           in;\n"
													"layout(triangle_strip, max_vertices = 4) out;\n"
													"\n"
													"in  vec4 tes_gs_result[];\n"
													"out vec4 gs_fs_result;\n"
													"uniform T2 uni_left;\n"
													"uniform T2 uni_right;\n"
													"\n"
													"FUNCTION_DEFINITION"
													"\n"
													"void main()\n"
													"{\n"
													"    vec4 result = vec4(0, 1, 0, 1);\n"
													"\n"
													"VERIFICATION"
													"    else if (vec4(0, 1, 0, 1) != tes_gs_result[0])\n"
													"    {\n"
													"         result = vec4(1, 0, 0, 1);\n"
													"    }\n"
													"\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(-1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, -1, 0, 1);\n"
													"    EmitVertex();\n"
													"    gs_fs_result = result;\n"
													"    gl_Position  = vec4(1, 1, 0, 1);\n"
													"    EmitVertex();\n"
													"}\n"
													"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"uniform T2 uni_left;\n"
		"uniform T2 uni_right;\n"
		"\n"
		"FUNCTION_DEFINITION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(0, 1, 0, 1);\n"
		"\n"
		"VERIFICATION"
		"    else if (vec4(0, 1, 0, 1) != vs_tcs_result[gl_InvocationID])\n"
		"    {\n"
		"         result = vec4(1, 0, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template = "VERSION\n"
													 "\n"
													 "layout(isolines, point_mode) in;\n"
													 "\n"
													 "in  vec4 tcs_tes_result[];\n"
													 "out vec4 tes_gs_result;\n"
													 "uniform T2 uni_left;\n"
													 "uniform T2 uni_right;\n"
													 "\n"
													 "FUNCTION_DEFINITION"
													 "\n"
													 "void main()\n"
													 "{\n"
													 "    vec4 result = vec4(0, 1, 0, 1);\n"
													 "\n"
													 "VERIFICATION"
													 "    else if (vec4(0, 1, 0, 1) != tcs_tes_result[0])\n"
													 "    {\n"
													 "         result = vec4(1, 0, 0, 1);\n"
													 "    }\n"
													 "\n"
													 "    tes_gs_result = result;\n"
													 "}\n"
													 "\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "uniform T2 uni_left;\n"
												  "uniform T2 uni_right;\n"
												  "\n"
												  "FUNCTION_DEFINITION"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(0, 1, 0, 1);\n"
												  "\n"
												  "VERIFICATION"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	GLuint			   n_rows		   = m_current_test_case_index + 1;
	const GLchar*	  t1			   = Utils::getTypeName(Utils::INT, 1, n_rows);
	const GLchar*	  t2			   = Utils::getTypeName(Utils::UINT, 1, n_rows);
	const std::string& value_list	  = getValueList(n_rows);
	const GLchar*	  shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("FUNCTION_DEFINITION", position, function_definition, out_source.m_parts[0].m_code);

	Utils::replaceToken("VERIFICATION", position, verification_snippet, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("VALUE_LIST", value_list.c_str(), out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("T1", t1, out_source.m_parts[0].m_code);

	Utils::replaceAllTokens("T2", t2, out_source.m_parts[0].m_code);
}